

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

void __thiscall TCMallocTest_Realloc_Test::TestBody(TCMallocTest_Realloc_Test *this)

{
  bool bVar1;
  TestingPortal *pTVar2;
  ulong uVar3;
  long *ptr;
  void *val;
  char *pcVar4;
  _func_void_ptr_void_ptr_unsigned_long *p_Var5;
  AssertHelper local_100;
  Message local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_2;
  void *new_p_1;
  int d_1;
  Message local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  void *new_p;
  int d;
  Message local_98;
  void *local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  void *local_68;
  void *p;
  undefined8 uStack_58;
  int s;
  int deltas [8];
  int start_sizes [4];
  undefined1 local_20 [8];
  Cleanup<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_alk[P]gperftools_src_tests_tcmalloc_unittest_cc:132:28)>
  cleanup;
  TCMallocTest_Realloc_Test *this_local;
  
  cleanup.callback_.old_value = (double)this;
  pTVar2 = tcmalloc::TestingPortal::Get();
  uVar3 = (**(code **)(*(long *)pTVar2 + 8))();
  if ((uVar3 & 1) == 0) {
    pTVar2 = tcmalloc::TestingPortal::Get();
    ptr = (long *)(**(code **)(*(long *)pTVar2 + 0x28))();
    (anonymous_namespace)::SetFlag<long,int>((_anonymous_namespace_ *)local_20,ptr,0);
    deltas[6] = 100;
    deltas[7] = 1000;
    uStack_58 = 0xfffffffe00000001;
    deltas[0] = 4;
    deltas[1] = -8;
    deltas[2] = 0x10;
    deltas[3] = -0x20;
    deltas[4] = 0x40;
    deltas[5] = -0x80;
    for (p._4_4_ = 0; p._4_4_ < 4; p._4_4_ = p._4_4_ + 1) {
      val = malloc((long)deltas[(long)(int)p._4_4_ + 6]);
      local_68 = noopt<void*>(val);
      local_90 = (void *)0x0;
      testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                ((internal *)local_88,"p","nullptr",&local_68,&local_90);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
      if (!bVar1) {
        testing::Message::Message(&local_98);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&d,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                   ,0x2d1,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&d,&local_98);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&d);
        testing::Message::~Message(&local_98);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
      if (!bVar1) break;
      for (new_p._0_4_ = 0;
          SBORROW4((int)new_p,(p._4_4_ + 1) * 2) != (int)((int)new_p + (p._4_4_ + 1) * -2) < 0;
          new_p._0_4_ = (int)new_p + 1) {
        p_Var5 = __noopt<void*(*)(void*,unsigned_long)noexcept>_void_____void__unsigned_long_noexcept__
                           (realloc);
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(*p_Var5)(local_68,(long)(deltas[(long)(int)p._4_4_ + 6] +
                                        deltas[(long)(int)new_p + -2]));
        testing::internal::EqHelper::Compare<void_*,_void_*,_nullptr>
                  ((EqHelper *)local_c0,"p","new_p",&local_68,(void **)&gtest_ar_1.message_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
        if (!bVar1) {
          testing::Message::Message(&local_c8);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xffffffffffffff30,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                     ,0x2d5,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xffffffffffffff30,&local_c8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff30);
          testing::Message::~Message(&local_c8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
        if (!bVar1) goto LAB_00111dd8;
      }
      for (new_p_1._4_4_ = 0;
          SBORROW4(new_p_1._4_4_,p._4_4_ * 2) != (int)(new_p_1._4_4_ + p._4_4_ * -2) < 0;
          new_p_1._4_4_ = new_p_1._4_4_ + 1) {
        p_Var5 = __noopt<void*(*)(void*,unsigned_long)noexcept>_void_____void__unsigned_long_noexcept__
                           (realloc);
        gtest_ar_2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(*p_Var5)(local_68,(long)(deltas[(long)(int)p._4_4_ + 6] -
                                        deltas[(long)new_p_1._4_4_ + -2]));
        testing::internal::EqHelper::Compare<void_*,_void_*,_nullptr>
                  ((EqHelper *)local_f0,"p","new_p",&local_68,(void **)&gtest_ar_2.message_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
        if (!bVar1) {
          testing::Message::Message(&local_f8);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
          testing::internal::AssertHelper::AssertHelper
                    (&local_100,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                     ,0x2da,pcVar4);
          testing::internal::AssertHelper::operator=(&local_100,&local_f8);
          testing::internal::AssertHelper::~AssertHelper(&local_100);
          testing::Message::~Message(&local_f8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
        if (!bVar1) goto LAB_00111dd8;
      }
      free(local_68);
    }
LAB_00111dd8:
    tcmalloc::
    Cleanup<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:132:28)>
    ::~Cleanup((Cleanup<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_alk[P]gperftools_src_tests_tcmalloc_unittest_cc:132:28)>
                *)local_20);
  }
  return;
}

Assistant:

TEST(TCMallocTest, Realloc) {
  if (TestingPortal::Get()->IsDebuggingMalloc()) {
    // debug alloc doesn't try to minimize reallocs
    return;
  }
  // When sampling, we always allocate in units of page-size, which
  // makes reallocs of small sizes do extra work (thus, failing these
  // checks).  Since sampling is random, we turn off sampling to make
  // sure that doesn't happen to us here.

  // turn off sampling
  tcmalloc::Cleanup cleanup = SetFlag(&TestingPortal::Get()->GetSampleParameter(), 0);

  int start_sizes[] = { 100, 1000, 10000, 100000 };
  int deltas[] = { 1, -2, 4, -8, 16, -32, 64, -128 };

  for (int s = 0; s < sizeof(start_sizes)/sizeof(*start_sizes); ++s) {
    void* p = noopt(malloc(start_sizes[s]));
    ASSERT_NE(p, nullptr);
    // The larger the start-size, the larger the non-reallocing delta.
    for (int d = 0; d < (s+1) * 2; ++d) {
      void* new_p = noopt(realloc)(p, start_sizes[s] + deltas[d]);
      ASSERT_EQ(p, new_p);  // realloc should not allocate new memory
    }
    // Test again, but this time reallocing smaller first.
    for (int d = 0; d < s*2; ++d) {
      void* new_p = noopt(realloc)(p, start_sizes[s] - deltas[d]);
      ASSERT_EQ(p, new_p);  // realloc should not allocate new memory
    }
    free(p);
  }
}